

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_common.cpp
# Opt level: O0

void __thiscall
pstore::brokerface::fifo_path::fifo_path
          (fifo_path *this,czstring pipe_path,duration_type retry_timeout,uint max_retries,
          update_callback *cb)

{
  char *pcVar1;
  allocator local_31;
  update_callback *local_30;
  update_callback *cb_local;
  czstring pcStack_20;
  uint max_retries_local;
  czstring pipe_path_local;
  fifo_path *this_local;
  duration_type retry_timeout_local;
  
  local_30 = cb;
  cb_local._4_4_ = max_retries;
  pcStack_20 = pipe_path;
  pipe_path_local = (czstring)this;
  this_local = (fifo_path *)retry_timeout.__r;
  std::mutex::mutex(&this->open_server_pipe_mut_);
  std::atomic<bool>::atomic(&this->needs_delete_,false);
  pcVar1 = pcStack_20;
  if (pcStack_20 == (char *)0x0) {
    get_default_path_abi_cxx11_();
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&this->path_,pcVar1,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  (this->retry_timeout_).__r = (rep)this_local;
  this->max_retries_ = cb_local._4_4_;
  std::function<void_(pstore::brokerface::fifo_path::operation)>::function(&this->update_cb_,cb);
  return;
}

Assistant:

fifo_path::fifo_path (gsl::czstring const pipe_path, duration_type const retry_timeout,
                              unsigned const max_retries, update_callback cb)
                : path_{pipe_path == nullptr ? get_default_path () : pipe_path}
                , retry_timeout_{retry_timeout}
                , max_retries_{max_retries}
                , update_cb_{std::move (cb)} {}